

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_photogrammetry.cpp
# Opt level: O1

bool __thiscall
ON_AerialPhotoCameraPosition::SetOrientationRotation
          (ON_AerialPhotoCameraPosition *this,ON_Xform camera_rotation)

{
  double __y;
  double dVar1;
  long lVar2;
  double *pdVar3;
  ON_Xform *pOVar4;
  double __y_00;
  double dVar5;
  double local_a8;
  ON_3dVector local_80;
  ON_3dVector local_68;
  ON_3dVector local_50;
  ON_3dVector local_38;
  
  pdVar3 = (double *)&camera_rotation;
  pOVar4 = &this->m_orientation_rotation;
  for (lVar2 = 0x10; lVar2 != 0; lVar2 = lVar2 + -1) {
    pOVar4->m_xform[0][0] = *pdVar3;
    pdVar3 = pdVar3 + 1;
    pOVar4 = (ON_Xform *)(pOVar4->m_xform[0] + 1);
  }
  ON_3dVector::ON_3dVector
            (&local_68,camera_rotation.m_xform[0][0],camera_rotation.m_xform[1][0],
             camera_rotation.m_xform[2][0]);
  ON_3dVector::ON_3dVector
            (&local_50,camera_rotation.m_xform[0][1],camera_rotation.m_xform[1][1],
             camera_rotation.m_xform[2][1]);
  ON_3dVector::ON_3dVector
            (&local_80,camera_rotation.m_xform[0][2],camera_rotation.m_xform[1][2],
             camera_rotation.m_xform[2][2]);
  (this->m_orientation_right).z = local_68.z;
  (this->m_orientation_right).x = local_68.x;
  (this->m_orientation_right).y = local_68.y;
  (this->m_orientation_up).x = local_50.x;
  (this->m_orientation_up).y = local_50.y;
  (this->m_orientation_up).z = local_50.z;
  ON_3dVector::operator-(&local_38,&local_80);
  (this->m_orientation_direction).z = local_38.z;
  (this->m_orientation_direction).x = local_38.x;
  (this->m_orientation_direction).y = local_38.y;
  dVar5 = 1.0 - local_80.x * local_80.x;
  dVar1 = 0.0;
  if (0.0 < dVar5) {
    if (dVar5 < 0.0) {
      dVar1 = sqrt(dVar5);
    }
    else {
      dVar1 = SQRT(dVar5);
    }
  }
  dVar5 = 1.0;
  if ((ABS(dVar1) <= 2.220446049250313e-16) || (0.9999999999999998 <= ABS(local_80.x))) {
    dVar1 = 0.0;
    __y_00 = *(double *)(&DAT_006a8450 + (ulong)(local_80.x < 0.0) * 8);
  }
  else if ((ABS(local_80.x) <= 2.220446049250313e-16) ||
          (__y_00 = local_80.x, 0.9999999999999998 <= ABS(dVar1))) {
    __y_00 = 0.0;
    dVar1 = *(double *)(&DAT_006a8450 + (ulong)(dVar1 < 0.0) * 8);
  }
  __y = 0.0;
  if (dVar1 <= 0.0) {
    local_a8 = (double)(-(ulong)(-local_68.z == local_50.y) & (ulong)local_50.y |
                       ~-(ulong)(-local_68.z == local_50.y) &
                       (ulong)((local_50.y - local_68.z) * 0.5));
  }
  else {
    __y = -local_80.y / dVar1;
    dVar5 = local_80.z / dVar1;
    local_a8 = local_68.x / dVar1;
  }
  dVar5 = atan2(__y,dVar5);
  (this->m_orientation_angles_radians).x = dVar5;
  dVar1 = atan2(__y_00,dVar1);
  (this->m_orientation_angles_radians).y = dVar1;
  dVar1 = atan2(__y_00,local_a8);
  (this->m_orientation_angles_radians).z = dVar1;
  (this->m_orientation_angles_degrees).x =
       ((this->m_orientation_angles_radians).x * 180.0) / 3.141592653589793;
  (this->m_orientation_angles_degrees).y =
       ((this->m_orientation_angles_radians).y * 180.0) / 3.141592653589793;
  (this->m_orientation_angles_degrees).z = (dVar1 * 180.0) / 3.141592653589793;
  this->m_status = this->m_status | 2;
  return true;
}

Assistant:

bool ON_AerialPhotoCameraPosition::SetOrientationRotation(
    ON_Xform camera_rotation
    )
{
  m_orientation_rotation = camera_rotation;

  const ON_3dVector X(camera_rotation.m_xform[0][0],camera_rotation.m_xform[1][0],camera_rotation.m_xform[2][0]);
  const ON_3dVector Y(camera_rotation.m_xform[0][1],camera_rotation.m_xform[1][1],camera_rotation.m_xform[2][1]);
  const ON_3dVector Z(camera_rotation.m_xform[0][2],camera_rotation.m_xform[1][2],camera_rotation.m_xform[2][2]);

  m_orientation_right = X;
  m_orientation_up = Y;
  m_orientation_direction = -Z;

  double s1, c1, s2, c2, s3, c3;

  s2 = Z.x;
  double a = 1.0 - s2*s2;
  c2 = (a > 0.0) ? sqrt(a) : 0.0;
  if ( fabs(c2) <= ON_EPSILON || fabs(s2) >= 1.0-ON_EPSILON )
  {
    s2 = (s2 < 0.0) ? -1.0 : 1.0;
    c2 = 0.0;
  }
  else if ( fabs(s2) <= ON_EPSILON || fabs(c2) >= 1.0-ON_EPSILON )
  {
    c2 = (c2 < 0.0) ? -1.0 : 1.0;
    s2 = 0.0;
  }

  if ( c2 > 0.0 )
  {
    s1 = -Z.y/c2;
    c1 =  Z.z/c2;
    s3 = -Y.x/c2;
    c3 =  X.x/c2;
  }
  else
  {
    s1 = 0.0;
    c1 = 1.0;
    s3 = ( X.y ==  Y.z ) ? X.y : 0.5*(X.y + Y.z);
    c3 = ( Y.y == -X.z ) ? Y.y : 0.5*(Y.y - X.z);
  }

  m_orientation_angles_radians.x = atan2(s1,c1);
  m_orientation_angles_radians.y = atan2(s2,c2);
  m_orientation_angles_radians.z = atan2(s2,c3);

  m_orientation_angles_degrees.x = m_orientation_angles_radians.x*180.0/ON_PI;
  m_orientation_angles_degrees.y = m_orientation_angles_radians.y*180.0/ON_PI;
  m_orientation_angles_degrees.z = m_orientation_angles_radians.z*180.0/ON_PI;

  m_status |= 2;

  return true;
}